

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polish.c
# Opt level: O3

c_int polish(OSQPWorkspace *work)

{
  double dVar1;
  c_int *pcVar2;
  csc *pcVar3;
  c_int *pcVar4;
  c_int *pcVar5;
  c_int *pcVar6;
  OSQPInfo *pOVar7;
  double dVar8;
  double dVar9;
  LinSysSolver *pLVar10;
  csc *pcVar11;
  OSQPData *pOVar12;
  c_int cVar13;
  c_float *pcVar14;
  c_float *pcVar15;
  c_float *pcVar16;
  OSQPPolish *pOVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  c_int cVar23;
  c_float cVar24;
  LinSysSolver *plsh;
  LinSysSolver *local_38;
  
  osqp_tic(work->timer);
  pOVar17 = work->pol;
  pOVar17->n_low = 0;
  pOVar17->n_upp = 0;
  pOVar12 = work->data;
  if (0 < pOVar12->m) {
    pcVar14 = work->y;
    pcVar15 = work->z;
    pcVar16 = pOVar12->l;
    pcVar2 = pOVar17->A_to_Alow;
    lVar21 = 0;
    do {
      lVar22 = -1;
      if (pcVar15[lVar21] - pcVar16[lVar21] < -pcVar14[lVar21]) {
        pOVar17->Alow_to_A[pOVar17->n_low] = lVar21;
        lVar22 = pOVar17->n_low;
        pOVar17->n_low = lVar22 + 1;
      }
      pcVar2[lVar21] = lVar22;
      lVar21 = lVar21 + 1;
    } while (lVar21 < pOVar12->m);
    if (0 < pOVar12->m) {
      pcVar16 = pOVar12->u;
      pcVar2 = pOVar17->A_to_Aupp;
      lVar21 = 0;
      do {
        lVar22 = -1;
        if (pcVar16[lVar21] - pcVar15[lVar21] < pcVar14[lVar21]) {
          pOVar17->Aupp_to_A[pOVar17->n_upp] = lVar21;
          lVar22 = pOVar17->n_upp;
          pOVar17->n_upp = lVar22 + 1;
        }
        pcVar2[lVar21] = lVar22;
        lVar21 = lVar21 + 1;
      } while (lVar21 < pOVar12->m);
    }
  }
  lVar21 = pOVar17->n_upp + pOVar17->n_low;
  if (lVar21 == 0) {
    pcVar11 = csc_spalloc(0,pOVar12->n,0,1,0);
    work->pol->Ared = pcVar11;
    if (pcVar11 == (csc *)0x0) goto LAB_0010b052;
    lVar21 = 0;
    int_vec_set_scalar(pcVar11->p,0,work->data->n + 1);
    pOVar12 = work->data;
    pcVar11 = work->pol->Ared;
  }
  else {
    pcVar11 = pOVar12->A;
    if (pcVar11->p[pcVar11->n] < 1) {
      cVar13 = 0;
    }
    else {
      cVar13 = 0;
      lVar22 = 0;
      do {
        if ((pOVar17->A_to_Alow[pcVar11->i[lVar22]] != -1) ||
           (pOVar17->A_to_Aupp[pcVar11->i[lVar22]] != -1)) {
          cVar13 = cVar13 + 1;
        }
        lVar22 = lVar22 + 1;
      } while (pcVar11->p[pcVar11->n] != lVar22);
    }
    pcVar11 = csc_spalloc(lVar21,pOVar12->n,cVar13,1,0);
    pOVar17 = work->pol;
    pOVar17->Ared = pcVar11;
    if (pcVar11 == (csc *)0x0) {
LAB_0010b052:
      work->info->status_polish = -1;
      return -1;
    }
    pOVar12 = work->data;
    lVar21 = pOVar12->n;
    pcVar2 = pcVar11->p;
    if (lVar21 < 1) {
      cVar13 = 0;
    }
    else {
      pcVar3 = pOVar12->A;
      pcVar4 = pcVar3->p;
      cVar13 = 0;
      lVar22 = 0;
      do {
        pcVar2[lVar22] = cVar13;
        lVar21 = pcVar4[lVar22];
        cVar23 = pcVar4[lVar22 + 1];
        lVar22 = lVar22 + 1;
        if (lVar21 < cVar23) {
          pcVar5 = pOVar17->A_to_Alow;
          pcVar6 = pcVar3->i;
          do {
            lVar18 = pcVar5[pcVar6[lVar21]];
            if (lVar18 == -1) {
              if (pOVar17->A_to_Aupp[pcVar6[lVar21]] != -1) {
                lVar18 = pOVar17->A_to_Aupp[pcVar6[lVar21]] + pOVar17->n_low;
                goto LAB_0010afba;
              }
            }
            else {
LAB_0010afba:
              pcVar11->i[cVar13] = lVar18;
              pcVar11->x[cVar13] = pcVar3->x[lVar21];
              cVar13 = cVar13 + 1;
              cVar23 = pcVar4[lVar22];
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < cVar23);
        }
        lVar21 = pOVar12->n;
      } while (lVar22 < lVar21);
    }
    pcVar2[lVar21] = cVar13;
    lVar21 = pOVar17->n_upp + pOVar17->n_low;
    if (lVar21 < 0) goto LAB_0010b052;
  }
  cVar13 = init_linsys_solver(&local_38,pOVar12->P,pcVar11,work->settings->delta,(c_float *)0x0,
                              work->settings->linsys_solver,1);
  if (cVar13 != 0) {
    work->info->status_polish = -1;
    pcVar11 = work->pol->Ared;
    if (pcVar11 != (csc *)0x0) {
      csc_spfree(pcVar11);
      return 1;
    }
    return 1;
  }
  pOVar12 = work->data;
  lVar22 = pOVar12->n;
  pcVar14 = (c_float *)malloc((lVar21 + lVar22) * 8);
  if (pcVar14 == (c_float *)0x0) {
    work->info->status_polish = -1;
    csc_spfree(work->pol->Ared);
    return -1;
  }
  if (0 < lVar22) {
    pcVar15 = pOVar12->q;
    lVar18 = 0;
    do {
      pcVar14[lVar18] = -pcVar15[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar22 != lVar18);
  }
  pOVar17 = work->pol;
  lVar18 = pOVar17->n_low;
  if (0 < lVar18) {
    pcVar15 = pOVar12->l;
    pcVar2 = pOVar17->Alow_to_A;
    lVar20 = 0;
    do {
      pcVar14[lVar22 + lVar20] = pcVar15[pcVar2[lVar20]];
      lVar20 = lVar20 + 1;
    } while (lVar18 != lVar20);
  }
  lVar20 = pOVar17->n_upp;
  if (0 < lVar20) {
    pcVar15 = pOVar12->u;
    pcVar2 = pOVar17->Aupp_to_A;
    lVar19 = 0;
    do {
      pcVar14[lVar22 + lVar18 + lVar19] = pcVar15[pcVar2[lVar19]];
      lVar19 = lVar19 + 1;
    } while (lVar20 != lVar19);
  }
  pcVar15 = vec_copy(pcVar14,lVar21 + lVar22);
  if (pcVar15 == (c_float *)0x0) {
    work->info->status_polish = -1;
    csc_spfree(work->pol->Ared);
LAB_0010b32a:
    free(pcVar14);
    return -1;
  }
  (*local_38->solve)(local_38,pcVar15);
  pLVar10 = local_38;
  if (0 < work->settings->polish_refine_iter) {
    lVar21 = work->pol->Ared->m + work->data->n;
    pcVar16 = (c_float *)malloc(lVar21 * 8);
    if (pcVar16 == (c_float *)0x0) {
      cVar13 = _osqp_error(OSQP_MEM_ALLOC_ERROR,"iterative_refinement");
      if (cVar13 != 0) {
        work->info->status_polish = -1;
        csc_spfree(work->pol->Ared);
        free(pcVar14);
        pcVar14 = pcVar15;
        goto LAB_0010b32a;
      }
    }
    else {
      lVar22 = 0;
      do {
        prea_vec_copy(pcVar14,pcVar16,lVar21);
        mat_vec(work->data->P,pcVar15,pcVar16,-1);
        mat_tpose_vec(work->data->P,pcVar15,pcVar16,-1,1);
        mat_tpose_vec(work->pol->Ared,pcVar15 + work->data->n,pcVar16,-1,0);
        mat_vec(work->pol->Ared,pcVar15,pcVar16 + work->data->n,-1);
        (*pLVar10->solve)(pLVar10,pcVar16);
        if (0 < lVar21) {
          lVar18 = 0;
          do {
            pcVar15[lVar18] = pcVar16[lVar18] + pcVar15[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar21 != lVar18);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < work->settings->polish_refine_iter);
      free(pcVar16);
    }
  }
  prea_vec_copy(pcVar15,work->pol->x,work->data->n);
  mat_vec(work->data->A,work->pol->x,work->pol->z,0);
  pOVar12 = work->data;
  pOVar17 = work->pol;
  lVar21 = pOVar17->n_low;
  if (pOVar17->n_upp + lVar21 == 0) {
    vec_set_scalar(pOVar17->y,0.0,pOVar12->m);
    pOVar17 = work->pol;
  }
  else {
    lVar22 = pOVar12->m;
    if (0 < lVar22) {
      lVar18 = pOVar12->n;
      pcVar2 = pOVar17->A_to_Alow;
      pcVar16 = pOVar17->y;
      lVar20 = 0;
      do {
        lVar19 = pcVar2[lVar20];
        if (lVar19 == -1) {
          if (pOVar17->A_to_Aupp[lVar20] != -1) {
            lVar19 = lVar21 + pOVar17->A_to_Aupp[lVar20];
            goto LAB_0010b375;
          }
          cVar24 = 0.0;
        }
        else {
LAB_0010b375:
          cVar24 = pcVar15[lVar18 + lVar19];
        }
        pcVar16[lVar20] = cVar24;
        lVar20 = lVar20 + 1;
      } while (lVar22 != lVar20);
    }
  }
  project_normalcone(work,pOVar17->z,pOVar17->y);
  update_info(work,0,1,1);
  pOVar17 = work->pol;
  pOVar7 = work->info;
  dVar1 = pOVar7->dua_res;
  dVar8 = pOVar17->pri_res;
  dVar9 = pOVar17->dua_res;
  if (((dVar8 < pOVar7->pri_res) && ((dVar9 < dVar1 || (dVar1 < 1e-10)))) ||
     ((pOVar7->pri_res < 1e-10 && (dVar9 < dVar1)))) {
    pOVar7->obj_val = pOVar17->obj_val;
    pOVar7->pri_res = dVar8;
    pOVar7->dua_res = dVar9;
    pOVar7->status_polish = 1;
    prea_vec_copy(pOVar17->x,work->x,work->data->n);
    prea_vec_copy(work->pol->z,work->z,work->data->m);
    prea_vec_copy(work->pol->y,work->y,work->data->m);
    if (work->settings->verbose != 0) {
      print_polish(work);
    }
  }
  else {
    pOVar7->status_polish = -1;
  }
  (*local_38->free)(local_38);
  csc_spfree(work->pol->Ared);
  free(pcVar14);
  free(pcVar15);
  return 0;
}

Assistant:

c_int polish(OSQPWorkspace *work) {
  c_int mred, polish_successful, exitflag;
  c_float *rhs_red;
  LinSysSolver *plsh;
  c_float *pol_sol; // Polished solution

#ifdef PROFILING
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Form Ared by assuming the active constraints and store in work->pol->Ared
  mred = form_Ared(work);
  if (mred < 0) { // work->pol->red = OSQP_NULL
    // Polishing failed
    work->info->status_polish = -1;

    return -1;
  }

  // Form and factorize reduced KKT
  exitflag = init_linsys_solver(&plsh, work->data->P, work->pol->Ared,
                                work->settings->delta, OSQP_NULL,
                                work->settings->linsys_solver, 1);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    if (work->pol->Ared) csc_spfree(work->pol->Ared);

    return 1;
  }

  // Form reduced right-hand side rhs_red
  rhs_red = c_malloc(sizeof(c_float) * (work->data->n + mred));
  if (!rhs_red) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);

    return -1;
  }
  form_rhs_red(work, rhs_red);

  pol_sol = vec_copy(rhs_red, work->data->n + mred);
  if (!pol_sol) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
  
    return -1;
  }

  // Solve the reduced KKT system
  plsh->solve(plsh, pol_sol);

  // Perform iterative refinement to compensate for the regularization error
  exitflag = iterative_refinement(work, plsh, pol_sol, rhs_red);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
    c_free(pol_sol);
  
    return -1;
  }

  // Store the polished solution (x,z,y)
  prea_vec_copy(pol_sol, work->pol->x, work->data->n);   // pol->x
  mat_vec(work->data->A, work->pol->x, work->pol->z, 0); // pol->z
  get_ypol_from_yred(work, pol_sol + work->data->n);     // pol->y

  // Ensure (z,y) satisfies normal cone constraint
  project_normalcone(work, work->pol->z, work->pol->y);

  // Compute primal and dual residuals at the polished solution
  update_info(work, 0, 1, 1);

  // Check if polish was successful
  polish_successful = (work->pol->pri_res < work->info->pri_res &&
                       work->pol->dua_res < work->info->dua_res) || // Residuals
                                                                    // are
                                                                    // reduced
                      (work->pol->pri_res < work->info->pri_res &&
                       work->info->dua_res < 1e-10) ||              // Dual
                                                                    // residual
                                                                    // already
                                                                    // tiny
                      (work->pol->dua_res < work->info->dua_res &&
                       work->info->pri_res < 1e-10);                // Primal
                                                                    // residual
                                                                    // already
                                                                    // tiny

  if (polish_successful) {
    // Update solver information
    work->info->obj_val       = work->pol->obj_val;
    work->info->pri_res       = work->pol->pri_res;
    work->info->dua_res       = work->pol->dua_res;
    work->info->status_polish = 1;

    // Update (x, z, y) in ADMM iterations
    // NB: z needed for warm starting
    prea_vec_copy(work->pol->x, work->x, work->data->n);
    prea_vec_copy(work->pol->z, work->z, work->data->m);
    prea_vec_copy(work->pol->y, work->y, work->data->m);

    // Print summary
#ifdef PRINTING

    if (work->settings->verbose) print_polish(work);
#endif /* ifdef PRINTING */
  } else { // Polishing failed
    work->info->status_polish = -1;

    // TODO: Try to find a better solution on the line connecting ADMM
    //       and polished solution
  }

  // Memory clean-up
  plsh->free(plsh);

  // Checks that they are not NULL are already performed earlier
  csc_spfree(work->pol->Ared);
  c_free(rhs_red);
  c_free(pol_sol);

  return 0;
}